

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

void __thiscall
wasm::WATParser::anon_unknown_11::WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDefsCtx>
::~WithPosition(WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDefsCtx> *this)

{
  Lexer::setIndex(&(this->ctx->in).lexer,(ulong)this->original);
  return;
}

Assistant:

~WithPosition() { ctx.in.lexer.setIndex(original); }